

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1dfb829::looksLikeSpecialVariable
          (anon_unknown_dwarf_1dfb829 *this,string *var,static_string_view prefix,size_t varNameLen)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  pcVar5 = prefix.super_string_view._M_str;
  pcVar1 = (char *)((long)&(var->_M_dataplus)._M_p + 3);
  if (pcVar1 <= pcVar5) {
    pcVar2 = *(char **)this;
    sVar3 = *(size_t *)(this + 8);
    local_68 = local_50;
    local_60 = 1;
    local_50[0] = 0x7b;
    local_70 = 1;
    views._M_len = 2;
    views._M_array = &local_80;
    local_80._M_len = (size_t)var;
    local_80._M_str = (char *)prefix.super_string_view._M_len;
    local_58 = local_68;
    cmCatViews_abi_cxx11_(&local_a0,views);
    __str._M_str = local_a0._M_dataplus._M_p;
    __str._M_len = local_a0._M_string_length;
    local_80._M_len = sVar3;
    local_80._M_str = pcVar2;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_80,0,local_a0._M_string_length,__str);
    if (iVar4 == 0) {
      bVar6 = pcVar5[*(long *)this + -1] == '}';
      goto LAB_004a340b;
    }
  }
  bVar6 = false;
LAB_004a340b:
  if ((pcVar1 <= pcVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}